

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

void __thiscall QCommandLineParser::showVersion(QCommandLineParser *this)

{
  long in_FS_OFFSET;
  QString local_100;
  Data *local_e8;
  char16_t *pcStack_e0;
  qsizetype local_d8;
  QString local_d0;
  QStringBuilder<QString,_char16_t> local_b8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_90;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t> local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::applicationName();
  local_b8.a.d.size = local_d8;
  local_b8.a.d.ptr = pcStack_e0;
  local_b8.a.d.d = local_e8;
  local_e8 = (Data *)0x0;
  pcStack_e0 = (char16_t *)0x0;
  local_d8 = 0;
  local_b8.b = L' ';
  QCoreApplication::applicationVersion();
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
            (&local_90,&local_b8,&local_100);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder(&local_58.a,&local_90);
  local_58.b = L'\n';
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>::
  convertTo<QString>(&local_d0,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    showMessageAndExit(Information,&local_d0,0);
  }
  __stack_chk_fail();
}

Assistant:

Q_NORETURN void QCommandLineParser::showVersion()
{
    showMessageAndExit(MessageType::Information,
                       QCoreApplication::applicationName() + u' '
                       + QCoreApplication::applicationVersion() + u'\n',
                       EXIT_SUCCESS);
}